

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utGenNormals.cpp
# Opt level: O2

void __thiscall GenNormalsTest::SetUp(GenNormalsTest *this)

{
  GenVertexNormalsProcess *this_00;
  aiMesh *this_01;
  undefined8 *puVar1;
  undefined8 *puVar2;
  aiVector3D *paVar3;
  
  this_00 = (GenVertexNormalsProcess *)operator_new(0x20);
  Assimp::GenVertexNormalsProcess::GenVertexNormalsProcess(this_00);
  this->piProcess = this_00;
  this_01 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_01);
  this->pcMesh = this_01;
  this_01->mPrimitiveTypes = 4;
  this_01->mNumFaces = 1;
  puVar1 = (undefined8 *)operator_new__(0x18);
  *puVar1 = 1;
  puVar1[2] = 0;
  this_01->mFaces = (aiFace *)(puVar1 + 1);
  *(undefined4 *)(puVar1 + 1) = 3;
  puVar2 = (undefined8 *)operator_new__(0xc);
  puVar1[2] = puVar2;
  *puVar2 = 0x100000000;
  *(undefined4 *)(puVar2 + 1) = 1;
  this_01->mNumVertices = 3;
  paVar3 = (aiVector3D *)operator_new__(0x24);
  this_01->mVertices = paVar3;
  paVar3->x = 0.0;
  paVar3->y = 1.0;
  *(undefined8 *)&paVar3->z = 0x4000000040c00000;
  paVar3[1].y = 3.0;
  paVar3[1].z = 1.0;
  paVar3[2].x = 3.0;
  paVar3[2].y = 2.0;
  paVar3[2].z = 4.0;
  return;
}

Assistant:

void GenNormalsTest::SetUp()
{
    piProcess = new GenVertexNormalsProcess();
    pcMesh = new aiMesh();
    pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
    pcMesh->mNumFaces = 1;
    pcMesh->mFaces = new aiFace[1];
    pcMesh->mFaces[0].mIndices = new unsigned int[pcMesh->mFaces[0].mNumIndices = 3];
    pcMesh->mFaces[0].mIndices[0] = 0;
    pcMesh->mFaces[0].mIndices[1] = 1;
    pcMesh->mFaces[0].mIndices[2] = 1;
    pcMesh->mNumVertices = 3;
    pcMesh->mVertices = new aiVector3D[3];
    pcMesh->mVertices[0] = aiVector3D(0.0f,1.0f,6.0f);
    pcMesh->mVertices[1] = aiVector3D(2.0f,3.0f,1.0f);
    pcMesh->mVertices[2] = aiVector3D(3.0f,2.0f,4.0f);
}